

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::tryParseDouble(char *s,char *s_end,double *result)

{
  byte bVar1;
  undefined1 auVar2 [16];
  int iVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  char cVar8;
  ulong uVar9;
  byte *pbVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar16 [16];
  undefined1 auVar17 [64];
  undefined8 in_XMM3_Qb;
  double local_48;
  undefined1 extraout_var [56];
  
  if (s_end <= s) {
    return false;
  }
  cVar8 = *s;
  if ((cVar8 == '-') || (cVar8 == '+')) {
    pbVar10 = (byte *)(s + 1);
    s = (char *)pbVar10;
    if (pbVar10 == (byte *)s_end) goto LAB_00e5e8b2;
    bVar11 = true;
    auVar17 = ZEXT1664(ZEXT816(0));
    if (*pbVar10 != 0x2e) goto LAB_00e5e8b8;
LAB_00e5e930:
    uVar9 = 1;
    iVar5 = -1;
    while( true ) {
      auVar14 = auVar17._0_16_;
      s = (char *)(pbVar10 + uVar9);
      if (s == s_end) break;
      uVar4 = (uint)*s;
      if (9 < uVar4 - 0x30) goto LAB_00e5e9b8;
      if (uVar9 < 8) {
        auVar12._8_8_ = 0;
        auVar12._0_8_ = tryParseDouble::pow_lut[uVar9];
      }
      else {
        auVar15._0_8_ = pow(10.0,(double)iVar5);
        auVar15._8_56_ = extraout_var;
        auVar12 = auVar15._0_16_;
      }
      auVar16._0_8_ = (double)(int)(uVar4 - 0x30);
      auVar16._8_8_ = in_XMM3_Qb;
      uVar9 = uVar9 + 1;
      iVar5 = iVar5 + -1;
      auVar14 = vfmadd231sd_fma(auVar14,auVar12,auVar16);
      auVar17 = ZEXT1664(auVar14);
    }
LAB_00e5ea65:
    auVar2._8_8_ = 0x8000000000000000;
    auVar2._0_8_ = 0x8000000000000000;
    auVar12 = vxorpd_avx512vl(auVar14,auVar2);
    bVar11 = true;
    *result = (double)((ulong)(cVar8 == '+') * auVar14._0_8_ + (ulong)(cVar8 != '+') * auVar12._0_8_
                      );
  }
  else {
    if ((int)cVar8 - 0x30U < 10) {
      cVar8 = '+';
LAB_00e5e8b2:
      bVar11 = s != s_end;
LAB_00e5e8b8:
      auVar17 = ZEXT864(0) << 0x40;
      iVar5 = 0;
      while ((auVar14 = auVar17._0_16_, bVar11 && (bVar1 = *s, (int)(char)bVar1 - 0x30U < 10))) {
        s = (char *)((byte *)s + 1);
        bVar11 = s != s_end;
        iVar5 = iVar5 + -1;
        auVar17 = ZEXT864((ulong)(auVar17._0_8_ * 10.0 + (double)(int)((int)(char)bVar1 - 0x30U)));
      }
      if (iVar5 != 0) {
        if (bVar11) goto LAB_00e5e911;
        goto LAB_00e5ea65;
      }
    }
    else if (cVar8 == '.') {
      cVar8 = '+';
      auVar17 = ZEXT1664(ZEXT816(0));
LAB_00e5e911:
      auVar14 = auVar17._0_16_;
      bVar1 = *s;
      uVar4 = (uint)bVar1;
      if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
LAB_00e5e9b8:
        if ((uVar4 & 0xff | 0x20) == 0x65) {
          bVar1 = ((byte *)s)[1];
          pbVar10 = (byte *)s + 1;
          if ((pbVar10 == (byte *)s_end) || ((bVar1 != 0x2d && (bVar1 != 0x2b)))) {
            if (9 < (int)(char)bVar1 - 0x30U) goto LAB_00e5ea88;
            iVar5 = 1;
          }
          else {
            pbVar10 = (byte *)s + 2;
            iVar5 = ((bVar1 == 0x2b) - 1) + (uint)(bVar1 == 0x2b);
          }
          iVar3 = (int)s_end - (int)pbVar10;
          iVar7 = 0;
          for (lVar6 = 0; pbVar10 + lVar6 != (byte *)s_end; lVar6 = lVar6 + 1) {
            uVar4 = (int)(char)pbVar10[lVar6] - 0x30;
            if (9 < uVar4) {
              iVar3 = (int)lVar6;
              break;
            }
            iVar7 = uVar4 + iVar7 * 10;
          }
          if (iVar3 == 0) goto LAB_00e5ea88;
          if (iVar7 != 0) {
            dVar13 = pow(5.0,(double)(iVar7 * iVar5));
            local_48 = auVar14._0_8_;
            auVar17._0_8_ = ldexp(dVar13 * local_48,iVar7 * iVar5);
            auVar17._8_56_ = extraout_var_00;
            auVar14 = auVar17._0_16_;
          }
        }
      }
      else {
        pbVar10 = (byte *)s;
        if (bVar1 == 0x2e) goto LAB_00e5e930;
      }
      goto LAB_00e5ea65;
    }
LAB_00e5ea88:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

static bool tryParseDouble(const char *s, const char *s_end, double *result) {
  if (s >= s_end) {
    return false;
  }

  double mantissa = 0.0;
  // This exponent is base 2 rather than 10.
  // However the exponent we parse is supposed to be one of ten,
  // thus we must take care to convert the exponent/and or the
  // mantissa to a * 2^E, where a is the mantissa and E is the
  // exponent.
  // To get the final double we will use ldexp, it requires the
  // exponent to be in base 2.
  int exponent = 0;

  // NOTE: THESE MUST BE DECLARED HERE SINCE WE ARE NOT ALLOWED
  // TO JUMP OVER DEFINITIONS.
  char sign = '+';
  char exp_sign = '+';
  char const *curr = s;

  // How many characters were read in a loop.
  int read = 0;
  // Tells whether a loop terminated due to reaching s_end.
  bool end_not_reached = false;
  bool leading_decimal_dots = false;

  /*
          BEGIN PARSING.
  */

  // Find out what sign we've got.
  if (*curr == '+' || *curr == '-') {
    sign = *curr;
    curr++;
    if ((curr != s_end) && (*curr == '.')) {
      // accept. Somethig like `.7e+2`, `-.5234`
      leading_decimal_dots = true;
    }
  } else if (IS_DIGIT(*curr)) { /* Pass through. */
  } else if (*curr == '.') {
    // accept. Somethig like `.7e+2`, `-.5234`
    leading_decimal_dots = true;
  } else {
    goto fail;
  }

  // Read the integer part.
  end_not_reached = (curr != s_end);
  if (!leading_decimal_dots) {
    while (end_not_reached && IS_DIGIT(*curr)) {
      mantissa *= 10;
      mantissa += static_cast<int>(*curr - 0x30);
      curr++;
      read++;
      end_not_reached = (curr != s_end);
    }

    // We must make sure we actually got something.
    if (read == 0) goto fail;
  }

  // We allow numbers of form "#", "###" etc.
  if (!end_not_reached) goto assemble;

  // Read the decimal part.
  if (*curr == '.') {
    curr++;
    read = 1;
    end_not_reached = (curr != s_end);
    while (end_not_reached && IS_DIGIT(*curr)) {
      static const double pow_lut[] = {
          1.0, 0.1, 0.01, 0.001, 0.0001, 0.00001, 0.000001, 0.0000001,
      };
      const int lut_entries = sizeof pow_lut / sizeof pow_lut[0];

      // NOTE: Don't use powf here, it will absolutely murder precision.
      mantissa += static_cast<int>(*curr - 0x30) *
                  (read < lut_entries ? pow_lut[read] : std::pow(10.0, -read));
      read++;
      curr++;
      end_not_reached = (curr != s_end);
    }
  } else if (*curr == 'e' || *curr == 'E') {
  } else {
    goto assemble;
  }

  if (!end_not_reached) goto assemble;

  // Read the exponent part.
  if (*curr == 'e' || *curr == 'E') {
    curr++;
    // Figure out if a sign is present and if it is.
    end_not_reached = (curr != s_end);
    if (end_not_reached && (*curr == '+' || *curr == '-')) {
      exp_sign = *curr;
      curr++;
    } else if (IS_DIGIT(*curr)) { /* Pass through. */
    } else {
      // Empty E is not allowed.
      goto fail;
    }

    read = 0;
    end_not_reached = (curr != s_end);
    while (end_not_reached && IS_DIGIT(*curr)) {
      exponent *= 10;
      exponent += static_cast<int>(*curr - 0x30);
      curr++;
      read++;
      end_not_reached = (curr != s_end);
    }
    exponent *= (exp_sign == '+' ? 1 : -1);
    if (read == 0) goto fail;
  }

assemble:
  *result = (sign == '+' ? 1 : -1) *
            (exponent ? std::ldexp(mantissa * std::pow(5.0, exponent), exponent)
                      : mantissa);
  return true;
fail:
  return false;
}